

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_aiff.c
# Opt level: O0

int aiff_updateheader(t_soundfile *sf,size_t nframes)

{
  int iVar1;
  ssize_t sVar2;
  int32_t local_48;
  uint32_t local_44;
  int32_t inttmp;
  uint32_t uinttmp;
  size_t commsize;
  size_t headersize;
  size_t datasize;
  int swap;
  int isaiffc;
  size_t nframes_local;
  t_soundfile *sf_local;
  
  _swap = nframes;
  nframes_local = (size_t)sf;
  datasize._4_4_ = aiff_isaiffc(sf);
  iVar1 = sys_isbigendian();
  datasize._0_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  headersize = _swap * (long)*(int *)(nframes_local + 0x2c);
  commsize = 0xc;
  _inttmp = 0x1a;
  if (datasize._4_4_ != 0) {
    if (*(int *)(nframes_local + 0x18) == 4) {
      _inttmp = 0x34;
    }
    else {
      _inttmp = 0x2e;
    }
    commsize = 0x18;
  }
  local_44 = swap4((uint32_t)_swap,(uint)datasize);
  sVar2 = fd_write(*(int *)nframes_local,commsize + 10,&local_44,4);
  if (sVar2 < 4) {
    sf_local._4_4_ = 0;
  }
  else {
    commsize = _inttmp + commsize;
    local_48 = swap4s((int)headersize + 8,(uint)datasize);
    sVar2 = fd_write(*(int *)nframes_local,commsize + 4,&local_48,4);
    if (sVar2 < 4) {
      sf_local._4_4_ = 0;
    }
    else {
      commsize = commsize + 0x10;
      local_48 = swap4s((int)commsize + (int)headersize + -8,(uint)datasize);
      sVar2 = fd_write(*(int *)nframes_local,4,&local_48,4);
      if (sVar2 < 4) {
        sf_local._4_4_ = 0;
      }
      else {
        sf_local._4_4_ = 1;
      }
    }
  }
  return sf_local._4_4_;
}

Assistant:

static int aiff_updateheader(t_soundfile *sf, size_t nframes)
{
    int isaiffc = aiff_isaiffc(sf), swap = !sys_isbigendian();
    size_t datasize = nframes * sf->sf_bytesperframe,
           headersize = AIFFHEADSIZE, commsize = AIFFCOMMSIZE;
    uint32_t uinttmp;
    int32_t inttmp;

    if (isaiffc)
    {
            /* AIFF-C compression info */
        if (sf->sf_bytespersample == 4)
            commsize += 4 + AIFF_FL32_LEN;
        else
            commsize += 4 + AIFF_NONE_LEN;
        headersize += AIFFVERSIZE;
    }

        /* num frames */
    uinttmp = swap4((uint32_t)nframes, swap);
    if (fd_write(sf->sf_fd, headersize + 10, &uinttmp, 4) < 4)
        return 0;
    headersize += commsize;

        /* data chunk size (+ offset & block) */
    inttmp = swap4s((int32_t)datasize + 8, swap);
    if (fd_write(sf->sf_fd, headersize + 4, &inttmp, 4) < 4)
        return 0;
    headersize += AIFFDATASIZE;

        /* file header chunk size (- chunk header) */
    inttmp = swap4s((int32_t)(headersize + datasize - 8), swap);
    if (fd_write(sf->sf_fd, 4, &inttmp, 4) < 4)
        return 0;

#ifdef DEBUG_SOUNDFILE
    post("FORM %d", headersize + datasize - 8);
    post("  %s", (aiff_isaiffc(sf) ? "AIFC" : "AIFF"));
    post("COMM %d", commsize);
    post("  frames %d", nframes);
    post("SSND %d", datasize + 8);
#endif

    return 1;
}